

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_add_input_at(wally_tx *tx,uint32_t index,wally_tx_input *input)

{
  ulong uVar1;
  uchar *puVar2;
  wally_tx_witness_stack *pwVar3;
  _Bool _Var4;
  wally_tx_input *pwVar5;
  uchar *__dest;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  wally_tx_witness_stack *new_pegin_witness;
  uchar *local_70;
  uchar *local_68;
  uchar *local_60;
  uchar *local_58;
  wally_tx_witness_stack *local_48;
  wally_tx_witness_stack *local_40;
  uchar *local_38;
  
  _Var4 = is_valid_tx(tx);
  if (!_Var4) {
    return -2;
  }
  uVar7 = (ulong)index;
  uVar1 = tx->num_inputs;
  if (uVar1 < uVar7) {
    return -2;
  }
  _Var4 = is_valid_tx_input(input);
  if (!_Var4) {
    return -2;
  }
  if (tx->inputs_allocation_len <= uVar1) {
    pwVar5 = (wally_tx_input *)realloc_array(tx->inputs,tx->inputs_allocation_len,uVar1 + 1,0xd0);
    if (pwVar5 == (wally_tx_input *)0x0) {
      return -3;
    }
    clear_and_free(tx->inputs,tx->num_inputs * 0xd0);
    tx->inputs = pwVar5;
    tx->inputs_allocation_len = tx->inputs_allocation_len + 1;
  }
  memmove(tx->inputs + uVar7 + 1,tx->inputs + uVar7,(tx->num_inputs - uVar7) * 0xd0);
  pwVar5 = tx->inputs + uVar7;
  local_40 = (wally_tx_witness_stack *)0x0;
  local_48 = (wally_tx_witness_stack *)0x0;
  if (input->witness != (wally_tx_witness_stack *)0x0) {
    wally_tx_witness_stack_clone_alloc(input->witness,&local_48);
  }
  if (input->pegin_witness != (wally_tx_witness_stack *)0x0) {
    wally_tx_witness_stack_clone_alloc(input->pegin_witness,&local_40);
  }
  sVar6 = input->script_len;
  if (sVar6 == 0) {
    bVar8 = true;
    __dest = (uchar *)0x0;
  }
  else {
    puVar2 = input->script;
    __dest = (uchar *)wally_malloc(sVar6);
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,puVar2,sVar6);
    }
    bVar8 = __dest != (uchar *)0x0;
  }
  if (bVar8) {
    sVar6 = input->issuance_amount_len;
    if (sVar6 == 0) {
      bVar8 = true;
      local_68 = (uchar *)0x0;
    }
    else {
      puVar2 = input->issuance_amount;
      local_68 = (uchar *)wally_malloc(sVar6);
      if (local_68 != (uchar *)0x0) {
        memcpy(local_68,puVar2,sVar6);
      }
      bVar8 = local_68 != (uchar *)0x0;
    }
    if (bVar8) {
      sVar6 = input->inflation_keys_len;
      if (sVar6 == 0) {
        bVar8 = true;
        local_60 = (uchar *)0x0;
      }
      else {
        puVar2 = input->inflation_keys;
        local_60 = (uchar *)wally_malloc(sVar6);
        if (local_60 != (uchar *)0x0) {
          memcpy(local_60,puVar2,sVar6);
        }
        bVar8 = local_60 != (uchar *)0x0;
      }
      if (bVar8) {
        sVar6 = input->issuance_amount_rangeproof_len;
        if (sVar6 == 0) {
          bVar8 = true;
          local_70 = (uchar *)0x0;
        }
        else {
          puVar2 = input->issuance_amount_rangeproof;
          local_70 = (uchar *)wally_malloc(sVar6);
          if (local_70 != (uchar *)0x0) {
            memcpy(local_70,puVar2,sVar6);
          }
          bVar8 = local_70 != (uchar *)0x0;
        }
        if (bVar8) {
          sVar6 = input->inflation_keys_rangeproof_len;
          if (sVar6 == 0) {
            bVar8 = true;
            local_58 = (uchar *)0x0;
          }
          else {
            local_38 = input->inflation_keys_rangeproof;
            local_58 = (uchar *)wally_malloc(sVar6);
            if (local_58 != (uchar *)0x0) {
              memcpy(local_58,local_38,sVar6);
            }
            bVar8 = local_58 != (uchar *)0x0;
          }
          pwVar3 = local_48;
          if ((bVar8) &&
             (local_48 != (wally_tx_witness_stack *)0x0 ||
              input->witness == (wally_tx_witness_stack *)0x0)) {
            memcpy(pwVar5,input,0xd0);
            pwVar5->script = __dest;
            pwVar5->issuance_amount = local_68;
            pwVar5->inflation_keys = local_60;
            pwVar5->issuance_amount_rangeproof = local_70;
            pwVar5->inflation_keys_rangeproof = local_58;
            pwVar5->pegin_witness = local_40;
            pwVar5->witness = pwVar3;
            tx->num_inputs = tx->num_inputs + 1;
            return 0;
          }
          goto LAB_00505a23;
        }
      }
      else {
        local_70 = (uchar *)0x0;
      }
      local_58 = (uchar *)0x0;
    }
    else {
      local_60 = (uchar *)0x0;
      local_70 = (uchar *)0x0;
      local_58 = (uchar *)0x0;
    }
  }
  else {
    local_68 = (uchar *)0x0;
    local_60 = (uchar *)0x0;
    local_70 = (uchar *)0x0;
    local_58 = (uchar *)0x0;
  }
LAB_00505a23:
  clear_and_free(__dest,input->script_len);
  clear_and_free(local_68,input->issuance_amount_len);
  clear_and_free(local_60,input->inflation_keys_len);
  clear_and_free(local_70,input->issuance_amount_rangeproof_len);
  sVar6 = input->inflation_keys_rangeproof_len;
  clear_and_free(local_58,sVar6);
  _Var4 = SUB81(sVar6,0);
  tx_witness_stack_free(local_40,_Var4);
  tx_witness_stack_free(local_48,_Var4);
  memmove(tx->inputs + uVar7,tx->inputs + uVar7 + 1,(tx->num_inputs - uVar7) * 0xd0);
  return -3;
}

Assistant:

int wally_tx_add_input_at(struct wally_tx *tx, uint32_t index,
                          const struct wally_tx_input *input)
{
    if (!is_valid_tx(tx) || index > tx->num_inputs || !is_valid_tx_input(input))
        return WALLY_EINVAL;

    if (tx->num_inputs >= tx->inputs_allocation_len) {
        /* Expand the inputs array */
        struct wally_tx_input *p;
        p = realloc_array(tx->inputs, tx->inputs_allocation_len,
                          tx->num_inputs + 1, sizeof(*tx->inputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->inputs, tx->num_inputs * sizeof(*tx->inputs));
        tx->inputs = p;
        tx->inputs_allocation_len += 1;
    }

    memmove(tx->inputs + index + 1, tx->inputs + index,
            (tx->num_inputs - index) * sizeof(*input));

    if (!clone_input_to(tx->inputs + index, input)) {
        memmove(tx->inputs + index, tx->inputs + index + 1,
                (tx->num_inputs - index) * sizeof(*input)); /* Undo */
        return WALLY_ENOMEM;
    }

    tx->num_inputs += 1;
    return WALLY_OK;
}